

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

fdb_status fdb_kvs_rollback(fdb_kvs_handle **handle_ptr,fdb_seqnum_t seqnum)

{
  __int_type_conflict _Var1;
  byte bVar2;
  fdb_kvs_handle *handle;
  fdb_file_handle *pfVar3;
  fdb_kvs_id_t fVar4;
  hbtrie *phVar5;
  btreeblk_handle *pbVar6;
  filemgr *pfVar7;
  kvs_info *__ptr;
  long lVar8;
  fdb_log_callback_ex p_Var9;
  bid_t rawkey;
  char *pcVar10;
  fdb_kvs_handle *fhandle;
  bool bVar11;
  fdb_status status;
  hbtrie_result hVar12;
  fdb_kvs_handle *pfVar13;
  int rawkeylen;
  undefined1 *buf;
  char *pcStack_1a0;
  char *pcStack_190;
  undefined1 auStack_188 [8];
  undefined1 local_180 [8];
  fdb_config config;
  fdb_kvs_config kvs_config;
  undefined1 local_68 [4];
  uint sleep_time;
  bid_t id_root;
  bid_t seq_root;
  bid_t dummy;
  fdb_kvs_handle *local_48;
  char *local_40;
  fdb_kvs_handle *local_38;
  
  buf = auStack_188;
  status = FDB_RESULT_INVALID_HANDLE;
  if ((handle_ptr != (fdb_kvs_handle **)0x0) &&
     (handle = *handle_ptr, handle != (fdb_kvs_handle *)0x0)) {
    if (handle->kvs == (kvs_info *)0x0) {
      status = FDB_RESULT_INVALID_ARGS;
    }
    else {
      pfVar13 = handle->kvs->root;
      pfVar3 = handle->fhandle;
      pcStack_190 = (char *)0x143a4e;
      memcpy(local_180,&handle->config,0xf8);
      kvs_config.custom_cmp = (fdb_custom_cmp_variable)(handle->kvs_config).custom_cmp_param;
      config.num_blocks_readahead = *(uint32_t *)&handle->kvs_config;
      config.bottom_up_index_build = (bool)(handle->kvs_config).field_0x4;
      config._245_3_ = *(undefined3 *)&(handle->kvs_config).field_0x5;
      kvs_config._0_4_ = *(undefined4 *)&(handle->kvs_config).custom_cmp;
      kvs_config._4_4_ = *(undefined4 *)((long)&(handle->kvs_config).custom_cmp + 4);
      if (((handle->config).flags & 2) == 0) {
        pcStack_190 = (char *)0x143a6f;
        filemgr_mutex_lock(handle->file);
        pcStack_190 = (char *)0x143a7d;
        filemgr_set_rollback(handle->file,'\x01');
        pcStack_190 = (char *)0x143a86;
        bVar11 = wal_txn_exists(handle->file);
        if (bVar11) {
          pcStack_190 = (char *)0x143a95;
          filemgr_set_rollback(handle->file,'\0');
          pcStack_190 = (char *)0x143a9e;
          filemgr_mutex_unlock(handle->file);
          status = FDB_RESULT_FAIL_BY_TRANSACTION;
        }
        else {
          kvs_config.custom_cmp_param._4_4_ = 10000;
          local_48 = pfVar13;
          local_38 = (fdb_kvs_handle *)pfVar3;
          while( true ) {
            _Var1 = (handle->file->status).super___atomic_base<unsigned_char>._M_i;
            pcStack_190 = (char *)0x143b27;
            filemgr_mutex_unlock(handle->file);
            if (_Var1 != '\x01') break;
            pcStack_190 = (char *)0x143b3a;
            decaying_usleep((uint *)((long)&kvs_config.custom_cmp_param + 4),1000000);
            pcStack_190 = (char *)0x143b43;
            filemgr_mutex_lock(handle->file);
          }
          if (_Var1 == '\x04') {
            pcStack_190 = (char *)0x143b58;
            fdb_check_file_reopen(handle,(file_status_t *)0x0);
          }
          pcStack_190 = (char *)0x143b60;
          fdb_sync_db_header(handle);
          fhandle = local_38;
          pfVar13 = local_48;
          if (handle->seqnum < seqnum) {
            pcStack_190 = (char *)0x143b7d;
            filemgr_set_rollback(local_48->file,'\0');
            status = FDB_RESULT_NO_DB_INSTANCE;
          }
          else {
            pcStack_190 = (char *)0x143b94;
            local_40 = _fdb_kvs_get_name(handle,handle->file);
            if (seqnum == 0) {
              pcStack_190 = (char *)0x143c2f;
              status = _fdb_kvs_remove((fdb_file_handle *)fhandle,local_40,true);
              pcStack_190 = (char *)0x143c3e;
              filemgr_set_rollback(pfVar13->file,'\0');
            }
            else {
              pcStack_190 = (char *)0x143bb0;
              pfVar13 = (fdb_kvs_handle *)calloc(1,0x208);
              if (pfVar13 == (fdb_kvs_handle *)0x0) {
                pcStack_190 = (char *)0x143c4e;
                filemgr_set_rollback(handle->file,'\0');
                status = FDB_RESULT_ALLOC_FAIL;
              }
              else {
                pfVar13->max_seqnum = seqnum;
                p_Var9 = (handle->log_callback).callback_ex;
                (pfVar13->log_callback).callback = (handle->log_callback).callback;
                (pfVar13->log_callback).callback_ex = p_Var9;
                (pfVar13->log_callback).ctx_data = (handle->log_callback).ctx_data;
                pfVar13->fhandle = (fdb_file_handle *)fhandle;
                LOCK();
                (pfVar13->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
                UNLOCK();
                local_38 = pfVar13;
                if (handle->kvs->type == '\x01') {
                  pcStack_1a0 = (char *)0x143c19;
                  status = _fdb_kvs_open(handle->kvs->root,(fdb_config *)local_180,
                                         (fdb_kvs_config *)&config.num_blocks_readahead,handle->file
                                         ,handle->file->filename,local_40,pfVar13);
                }
                else {
                  pcStack_190 = (char *)0x143c74;
                  status = _fdb_open(pfVar13,handle->file->filename,FDB_AFILENAME,
                                     (fdb_config *)local_180);
                }
                pcStack_190 = (char *)0x143c82;
                filemgr_set_rollback(handle->file,'\0');
                pfVar13 = local_38;
                if (status == FDB_RESULT_SUCCESS) {
                  bVar2 = local_38->trie->chunksize;
                  pcStack_190 = (char *)0x143ca5;
                  filemgr_mutex_lock(handle->file);
                  pfVar13 = local_38;
                  lVar8 = -(ulong)(bVar2 + 0xf & 0xfffffff0);
                  buf = auStack_188 + lVar8;
                  fVar4 = local_38->kvs->id;
                  local_40 = (char *)(ulong)bVar2;
                  *(undefined8 *)(auStack_188 + lVar8 + -8) = 0x143cd0;
                  kvid2buf((ulong)bVar2,fVar4,buf);
                  pcVar10 = local_40;
                  phVar5 = pfVar13->trie;
                  dummy = (bid_t)buf;
                  *(undefined8 *)(auStack_188 + lVar8 + -8) = 0x143ce8;
                  hVar12 = hbtrie_find_partial(phVar5,buf,(int)pcVar10,local_68);
                  pbVar6 = pfVar13->bhandle;
                  *(undefined8 *)(auStack_188 + lVar8 + -8) = 0x143cf4;
                  btreeblk_end(pbVar6);
                  rawkey = dummy;
                  phVar5 = local_48->trie;
                  rawkeylen = (int)local_40;
                  if (hVar12 == HBTRIE_RESULT_SUCCESS) {
                    *(undefined8 *)(auStack_188 + lVar8 + -8) = 0x143d25;
                    hbtrie_insert_partial(phVar5,(void *)rawkey,rawkeylen,local_68,&seq_root);
                  }
                  else {
                    *(undefined8 *)(auStack_188 + lVar8 + -8) = 0x143d0e;
                    hbtrie_remove_partial(phVar5,(void *)rawkey,rawkeylen);
                  }
                  pfVar13 = local_48;
                  pbVar6 = local_48->bhandle;
                  *(undefined8 *)(auStack_188 + lVar8 + -8) = 0x143d33;
                  btreeblk_end(pbVar6);
                  if (config.wal_flush_before_commit == true) {
                    buf = &stack0xfffffffffffffe68 + lVar8;
                    fVar4 = local_38->kvs->id;
                    *(undefined8 *)((long)&pcStack_1a0 + lVar8) = 0x143d63;
                    kvid2buf(8,fVar4,buf);
                    phVar5 = (local_38->field_6).seqtrie;
                    *(undefined8 *)((long)&pcStack_1a0 + lVar8) = 0x143d7c;
                    hVar12 = hbtrie_find_partial(phVar5,buf,8,&id_root);
                    local_40 = (char *)CONCAT44(local_40._4_4_,hVar12);
                    pbVar6 = local_38->bhandle;
                    *(undefined8 *)((long)&pcStack_1a0 + lVar8) = 0x143d8c;
                    btreeblk_end(pbVar6);
                    phVar5 = (pfVar13->field_6).seqtrie;
                    if ((int)local_40 == 0) {
                      *(undefined8 *)((long)&pcStack_1a0 + lVar8) = 0x143dbb;
                      hbtrie_insert_partial(phVar5,buf,8,&id_root,&seq_root);
                    }
                    else {
                      *(undefined8 *)((long)&pcStack_1a0 + lVar8) = 0x143da4;
                      hbtrie_remove_partial(phVar5,buf,8);
                    }
                    pfVar13 = local_48;
                    pbVar6 = local_48->bhandle;
                    *(undefined8 *)((long)&pcStack_1a0 + lVar8) = 0x143dc9;
                    btreeblk_end(pbVar6);
                  }
                  pfVar7 = handle->file;
                  fVar4 = handle->kvs->id;
                  *(undefined8 *)(buf + -8) = 0x143dda;
                  local_40 = (char *)fdb_kvs_get_seqnum(pfVar7,fVar4);
                  pfVar7 = handle->file;
                  fVar4 = handle->kvs->id;
                  *(undefined8 *)(buf + -8) = 0x143df2;
                  fdb_kvs_set_seqnum(pfVar7,fVar4,seqnum);
                  handle->seqnum = seqnum;
                  pfVar7 = handle->file;
                  *(undefined8 *)(buf + -8) = 0x143e02;
                  filemgr_mutex_unlock(pfVar7);
                  pfVar13->rollback_revnum = local_38->rollback_revnum;
                  bVar2 = (handle->config).durability_opt;
                  *(undefined8 *)(buf + -8) = 0x143e2e;
                  status = _fdb_commit(pfVar13,'\x01',(bVar2 & 2) == 0);
                  pfVar13 = local_38;
                  if (status == FDB_RESULT_SUCCESS) {
                    *(undefined8 *)(buf + -8) = 0x143eaf;
                    _fdb_kvs_close(pfVar13);
                    *handle_ptr = handle;
                  }
                  else {
                    *(fdb_seqnum_t *)(buf + -8) = seqnum;
                    *(char **)(buf + -0x10) =
                         "Rollback failed due to a commit failure with a sequence number %lu";
                    *(undefined8 *)(buf + -0x18) = 0x143e6a;
                    fdb_log_impl(&handle->log_callback,2,status,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                                 ,"fdb_kvs_rollback",0x921,*(char **)(buf + -0x10));
                    pfVar7 = handle->file;
                    *(undefined8 *)(buf + -8) = 0x143e77;
                    filemgr_mutex_lock(pfVar7);
                    pcVar10 = local_40;
                    pfVar7 = handle->file;
                    fVar4 = handle->kvs->id;
                    *(undefined8 *)(buf + -8) = 0x143e8c;
                    fdb_kvs_set_seqnum(pfVar7,fVar4,(fdb_seqnum_t)pcVar10);
                    pfVar7 = handle->file;
                    *(undefined8 *)(buf + -8) = 0x143e95;
                    filemgr_mutex_unlock(pfVar7);
                    pfVar13 = local_38;
                    *(undefined8 *)(buf + -8) = 0x143ea1;
                    _fdb_kvs_close(pfVar13);
                  }
                  __ptr = pfVar13->kvs;
                  if (__ptr != (kvs_info *)0x0) {
                    *(undefined8 *)(buf + -8) = 0x143ec0;
                    free(__ptr);
                    local_38->kvs = (kvs_info *)0x0;
                    pfVar13 = local_38;
                  }
                }
                *(undefined8 *)(buf + -8) = 0x143ed4;
                free(pfVar13);
              }
            }
          }
        }
      }
      else {
        pcStack_190 = handle->file->filename;
        pcStack_1a0 = (char *)0x143afd;
        status = fdb_log_impl(&handle->log_callback,2,FDB_RESULT_RONLY_VIOLATION,
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                              ,"fdb_kvs_rollback",0x895,
                              "Warning: Rollback is not allowed on the read-only DB file \'%s\'.");
      }
    }
  }
  return status;
}

Assistant:

fdb_status fdb_kvs_rollback(fdb_kvs_handle **handle_ptr, fdb_seqnum_t seqnum)
{
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_handle *handle_in, *handle, *super_handle;
    fdb_status fs;
    fdb_seqnum_t old_seqnum;
    fdb_file_handle *fhandle;
    char *kvs_name;

    if (!handle_ptr) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    handle_in = *handle_ptr;

    if (!handle_in) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!handle_in->kvs) {
        return FDB_RESULT_INVALID_ARGS;
    }
    super_handle = handle_in->kvs->root;
    fhandle = handle_in->fhandle;
    config = handle_in->config;
    kvs_config = handle_in->kvs_config;

    if (handle_in->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&handle_in->log_callback, FDB_LOG_ERROR,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: Rollback is not allowed on "
                       "the read-only DB file '%s'.",
                       handle_in->file->filename);
    }

    filemgr_mutex_lock(handle_in->file);
    filemgr_set_rollback(handle_in->file, 1); // disallow writes operations
    // All transactions should be closed before rollback
    if (wal_txn_exists(handle_in->file)) {
        filemgr_set_rollback(handle_in->file, 0);
        filemgr_mutex_unlock(handle_in->file);
        return FDB_RESULT_FAIL_BY_TRANSACTION;
    }

    // If compaction is running, wait until it is aborted.
    // TODO: Find a better way of waiting for the compaction abortion.
    unsigned int sleep_time = 10000; // 10 ms.
    file_status_t fstatus = filemgr_get_file_status(handle_in->file);
    while (fstatus == FILE_COMPACT_OLD) {
        filemgr_mutex_unlock(handle_in->file);
        decaying_usleep(&sleep_time, 1000000);
        filemgr_mutex_lock(handle_in->file);
        fstatus = filemgr_get_file_status(handle_in->file);
    }
    if (fstatus == FILE_REMOVED_PENDING) {
        filemgr_mutex_unlock(handle_in->file);
        fdb_check_file_reopen(handle_in, NULL);
    } else {
        filemgr_mutex_unlock(handle_in->file);
    }

    fdb_sync_db_header(handle_in);

    // if the max sequence number seen by this handle is lower than the
    // requested snapshot marker, it means the snapshot is not yet visible
    // even via the current fdb_kvs_handle
    if (seqnum > handle_in->seqnum) {
        filemgr_set_rollback(super_handle->file, 0); // allow mutations
        return FDB_RESULT_NO_DB_INSTANCE;
    }

    kvs_name = _fdb_kvs_get_name(handle_in, handle_in->file);
    if (seqnum == 0) { // Handle special case of rollback to zero..
        fs = _fdb_kvs_remove(fhandle, kvs_name, true /*recreate!*/);
        filemgr_set_rollback(super_handle->file, 0); // allow mutations
        return fs;
    }

    handle = (fdb_kvs_handle *) calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        filemgr_set_rollback(handle_in->file, 0); // allow mutations
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    handle->max_seqnum = seqnum;
    handle->log_callback = handle_in->log_callback;
    handle->fhandle = fhandle;
    atomic_init_uint8_t(&handle->handle_busy, 0);

    if (handle_in->kvs->type == KVS_SUB) {
        fs = _fdb_kvs_open(handle_in->kvs->root,
                           &config,
                           &kvs_config,
                           handle_in->file,
                           handle_in->file->filename,
                           kvs_name,
                           handle);
    } else {
        fs = _fdb_open(handle, handle_in->file->filename,
                       FDB_AFILENAME, &config);
    }
    filemgr_set_rollback(handle_in->file, 0); // allow mutations

    if (fs == FDB_RESULT_SUCCESS) {
        // get KV instance's sub B+trees' root node BIDs
        // from both ID-tree and Seq-tree, AND
        // replace current handle's sub B+trees' root node BIDs
        // by old BIDs
        size_t size_chunk, size_id;
        bid_t id_root, seq_root, dummy;
        uint8_t *_kv_id;
        hbtrie_result hr;

        size_chunk = handle->trie->chunksize;
        size_id = sizeof(fdb_kvs_id_t);

        filemgr_mutex_lock(handle_in->file);

        // read root BID of the KV instance from the old handle
        // and overwrite into the current handle
        _kv_id = alca(uint8_t, size_chunk);
        kvid2buf(size_chunk, handle->kvs->id, _kv_id);
        hr = hbtrie_find_partial(handle->trie, _kv_id,
                                 size_chunk, &id_root);
        btreeblk_end(handle->bhandle);
        if (hr == HBTRIE_RESULT_SUCCESS) {
            hbtrie_insert_partial(super_handle->trie,
                                  _kv_id, size_chunk,
                                  &id_root, &dummy);
        } else { // No Trie info in rollback header.
                 // Erase kv store from super handle's main index.
            hbtrie_remove_partial(super_handle->trie, _kv_id, size_chunk);
        }
        btreeblk_end(super_handle->bhandle);

        if (config.seqtree_opt == FDB_SEQTREE_USE) {
            // same as above for seq-trie
            _kv_id = alca(uint8_t, size_id);
            kvid2buf(size_id, handle->kvs->id, _kv_id);
            hr = hbtrie_find_partial(handle->seqtrie, _kv_id,
                                     size_id, &seq_root);
            btreeblk_end(handle->bhandle);
            if (hr == HBTRIE_RESULT_SUCCESS) {
                hbtrie_insert_partial(super_handle->seqtrie,
                                      _kv_id, size_id,
                                      &seq_root, &dummy);
            } else { // No seqtrie info in rollback header.
                     // Erase kv store from super handle's seqtrie index.
                hbtrie_remove_partial(super_handle->seqtrie, _kv_id, size_id);
            }
            btreeblk_end(super_handle->bhandle);
        }

        old_seqnum = fdb_kvs_get_seqnum(handle_in->file,
                                        handle_in->kvs->id);
        fdb_kvs_set_seqnum(handle_in->file,
                           handle_in->kvs->id, seqnum);
        handle_in->seqnum = seqnum;
        filemgr_mutex_unlock(handle_in->file);

        super_handle->rollback_revnum = handle->rollback_revnum;
        fs = _fdb_commit(super_handle, FDB_COMMIT_MANUAL_WAL_FLUSH,
                         !(handle_in->config.durability_opt & FDB_DRB_ASYNC));
        if (fs == FDB_RESULT_SUCCESS) {
            _fdb_kvs_close(handle);
            *handle_ptr = handle_in;
            fdb_kvs_info_free(handle);
            free(handle);
        } else {
            // cancel the rolling-back of the sequence number
            fdb_log(&handle_in->log_callback, FDB_LOG_ERROR, fs,
                    "Rollback failed due to a commit failure with a sequence "
                    "number %" _F64, seqnum);
            filemgr_mutex_lock(handle_in->file);
            fdb_kvs_set_seqnum(handle_in->file,
                               handle_in->kvs->id, old_seqnum);
            filemgr_mutex_unlock(handle_in->file);
            _fdb_kvs_close(handle);
            fdb_kvs_info_free(handle);
            free(handle);
        }
    } else {
        free(handle);
    }

    return fs;
}